

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
operator<<(basic_ostream<char,_std::char_traits<char>_> *out,args<long_double,_3UL> *x)

{
  longdouble lVar1;
  size_type sVar2;
  const_reference pvVar3;
  array<long_double,_3UL> *in_RSI;
  ostream *in_RDI;
  size_t i;
  size_type in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd2;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    sVar2 = std::array<long_double,_3UL>::size(in_RSI);
    if (sVar2 <= local_18) break;
    pvVar3 = std::array<long_double,_3UL>::operator[]
                       ((array<long_double,_3UL> *)
                        CONCAT62(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    lVar1 = *(longdouble *)pvVar3;
    in_stack_ffffffffffffffc8 = SUB108(lVar1,0);
    in_stack_ffffffffffffffd0 = (undefined2)((unkuint10)lVar1 >> 0x40);
    std::ostream::operator<<(in_RDI,lVar1);
    if (local_18 + 1 < 3) {
      std::operator<<(in_RDI,", ");
    }
    local_18 = local_18 + 1;
  }
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<CharT, TraitT> &operator<<(std::basic_ostream<CharT, TraitT> &out,
                                                       const args &x) {
    for (std::size_t i{0}; i < x.size(); ++i) {
      out << x[i];
      if (i + 1 < n)
        out << ", ";
    }
    return out;
  }